

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl_trc.c
# Opt level: O0

void Curl_trc_cf_infof(Curl_easy *data,Curl_cfilter *cf,char *fmt,...)

{
  char in_AL;
  undefined8 in_RCX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_e8 [24];
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined1 local_38 [8];
  va_list ap;
  char *fmt_local;
  Curl_cfilter *cf_local;
  Curl_easy *data_local;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  if ((((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x89c >> 0x1e & 1) != 0)) &&
      (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level)))) &&
     ((cf != (Curl_cfilter *)0x0 && (0 < cf->cft->log_level)))) {
    ap[0].overflow_arg_area = local_e8;
    ap[0]._0_8_ = &stack0x00000008;
    local_38._4_4_ = 0x30;
    local_38._0_4_ = 0x18;
    local_d0 = in_RCX;
    local_c8 = in_R8;
    local_c0 = in_R9;
    ap[0].reg_save_area = fmt;
    trc_infof(data,(data->state).feat,cf->cft->name,cf->sockindex,fmt,(__va_list_tag *)local_38);
  }
  return;
}

Assistant:

void Curl_trc_cf_infof(struct Curl_easy *data, const struct Curl_cfilter *cf,
                       const char *fmt, ...)
{
  DEBUGASSERT(cf);
  if(Curl_trc_cf_is_verbose(cf, data)) {
    va_list ap;
    va_start(ap, fmt);
    trc_infof(data, data->state.feat, cf->cft->name, cf->sockindex, fmt, ap);
    va_end(ap);
  }
}